

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_dense.cpp
# Opt level: O0

void __thiscall
test_matrix_dense_constructors_initialiser_lists_Test::TestBody
          (test_matrix_dense_constructors_initialiser_lists_Test *this)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  reference pvVar3;
  char *pcVar4;
  array<double,_2UL> *paVar5;
  reference pvVar6;
  Vector_Dense<double,_0UL> *local_258;
  AssertHelper local_250;
  Message local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_7;
  Message local_228;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_6;
  Message local_208;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_5;
  Message local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_4;
  Message local_1c8;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_3;
  Message local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_2;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_1;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  initializer_list<double> local_140;
  double local_130 [2];
  initializer_list<double> local_120;
  Vector_Dense<double,_2UL> local_110;
  Vector_Dense<double,_2UL> local_100;
  initializer_list<Disa::Vector_Dense<double,_2UL>_> local_f0;
  undefined1 local_e0 [8];
  Matrix_Dense<double,_2UL,_2UL> static_matrix;
  initializer_list<double> local_b0 [2];
  double local_90 [2];
  initializer_list<double> local_80;
  Vector_Dense<double,_0UL> *local_70;
  Vector_Dense<double,_0UL> local_68;
  Vector_Dense<double,_0UL> local_50;
  undefined1 local_38 [24];
  Matrix_Dense<double,_0UL,_0UL> dynamic_matrix;
  test_matrix_dense_constructors_initialiser_lists_Test *this_local;
  
  local_70 = &local_68;
  local_90[0] = 1.0;
  local_90[1] = 2.0;
  local_80._M_array = local_90;
  local_80._M_len = 2;
  dynamic_matrix.
  super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(local_70,&local_80);
  local_70 = &local_50;
  static_matrix.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].
  super_array<double,_2UL>._M_elems[1] = 3.0;
  local_b0[0]._M_array =
       static_matrix.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].
       super_array<double,_2UL>._M_elems + 1;
  local_b0[0]._M_len = 2;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(local_70,local_b0);
  local_38._0_8_ = &local_68;
  local_38._8_8_ = (pointer)0x2;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)(local_38 + 0x10),
             (initializer_list<Disa::Vector_Dense<double,_0UL>_> *)local_38);
  local_258 = (Vector_Dense<double,_0UL> *)local_38;
  do {
    local_258 = local_258 + -1;
    Disa::Vector_Dense<double,_0UL>::~Vector_Dense(local_258);
  } while (local_258 != &local_68);
  local_130[0] = 5.0;
  local_130[1] = 6.0;
  local_120._M_array = local_130;
  local_120._M_len = 2;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense(&local_110,&local_120);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x401c000000000000;
  local_140._M_array = (iterator)&gtest_ar.message_;
  local_140._M_len = 2;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense(&local_100,&local_140);
  local_f0._M_array = &local_110;
  local_f0._M_len = 2;
  Disa::Matrix_Dense<double,_2UL,_2UL>::Matrix_Dense
            ((Matrix_Dense<double,_2UL,_2UL> *)local_e0,&local_f0);
  pvVar2 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),0)->super_vector<double,_std::allocator<double>_>;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_160,"dynamic_matrix[0][0]","1.0",*pvVar3,1.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x26,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  pvVar2 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),0)->super_vector<double,_std::allocator<double>_>;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_180,"dynamic_matrix[0][1]","2.0",*pvVar3,2.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x27,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  pvVar2 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),1)->super_vector<double,_std::allocator<double>_>;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1a0,"dynamic_matrix[1][0]","3.0",*pvVar3,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x28,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  pvVar2 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)(local_38 + 0x10),1)->super_vector<double,_std::allocator<double>_>;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1c0,"dynamic_matrix[1][1]","4.0",*pvVar3,4.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x29,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  paVar5 = &std::array<Disa::Vector_Dense<double,_2UL>,_2UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_2UL>,_2UL> *)local_e0,0)->
            super_array<double,_2UL>;
  pvVar6 = std::array<double,_2UL>::operator[](paVar5,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1e0,"static_matrix[0][0]","5.0",*pvVar6,5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x2a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  paVar5 = &std::array<Disa::Vector_Dense<double,_2UL>,_2UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_2UL>,_2UL> *)local_e0,0)->
            super_array<double,_2UL>;
  pvVar6 = std::array<double,_2UL>::operator[](paVar5,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_200,"static_matrix[0][1]","6.0",*pvVar6,6.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x2b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  paVar5 = &std::array<Disa::Vector_Dense<double,_2UL>,_2UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_2UL>,_2UL> *)local_e0,1)->
            super_array<double,_2UL>;
  pvVar6 = std::array<double,_2UL>::operator[](paVar5,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_220,"static_matrix[1][0]","7.0",*pvVar6,7.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x2c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  paVar5 = &std::array<Disa::Vector_Dense<double,_2UL>,_2UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_2UL>,_2UL> *)local_e0,1)->
            super_array<double,_2UL>;
  pvVar6 = std::array<double,_2UL>::operator[](paVar5,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_240,"static_matrix[1][1]","8.0",*pvVar6,8.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x2d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  Disa::Matrix_Dense<double,_0UL,_0UL>::~Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)(local_38 + 0x10));
  return;
}

Assistant:

TEST(test_matrix_dense, constructors_initialiser_lists) {

  Matrix_Dense<Scalar, 0, 0> dynamic_matrix = {{1.0, 2.0}, {3.0, 4.0}};
  Matrix_Dense<Scalar, 2, 2> static_matrix = {{5.0, 6.0}, {7.0, 8.0}};

  EXPECT_DOUBLE_EQ(dynamic_matrix[0][0], 1.0);
  EXPECT_DOUBLE_EQ(dynamic_matrix[0][1], 2.0);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][0], 3.0);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][1], 4.0);
  EXPECT_DOUBLE_EQ(static_matrix[0][0], 5.0);
  EXPECT_DOUBLE_EQ(static_matrix[0][1], 6.0);
  EXPECT_DOUBLE_EQ(static_matrix[1][0], 7.0);
  EXPECT_DOUBLE_EQ(static_matrix[1][1], 8.0);
}